

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

_Bool has_illegal_characters(char *str,size_t len)

{
  _Bool _Var1;
  ulong local_28;
  size_t i;
  size_t len_local;
  char *str_local;
  
  local_28 = 0;
  while( true ) {
    if (len <= local_28) {
      return false;
    }
    _Var1 = is_visible_character(str[local_28]);
    if (!_Var1) break;
    _Var1 = is_delimiter(str[local_28]);
    if (_Var1) {
      return true;
    }
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

static bool has_illegal_characters(const char *str, size_t len)
{
	for (size_t i = 0; i < len; i++) {
		if (!is_visible_character(str[i])) {
			return true;
		}

		if (is_delimiter(str[i])) {
			return true;
		}
	}

	return false;
}